

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O1

void __thiscall fileStoreFixture::~fileStoreFixture(fileStoreFixture *this)

{
  string local_58;
  string local_38;
  
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  if (this->resetAfter == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"SETGET","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TEST","");
    FIX::deleteSession(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  *(code **)this = std::logic_error::logic_error;
  FIX::Dictionary::~Dictionary((Dictionary *)&this->field_0x58);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)&this->field_0x28);
  if (*(undefined1 **)&this->field_0x8 != &this->field_0x18) {
    operator_delete(*(undefined1 **)&this->field_0x8,*(long *)&this->field_0x18 + 1);
  }
  return;
}

Assistant:

~fileStoreFixture() {
    factory.destroy(object);

    if (resetAfter) {
      deleteSession("SETGET", "TEST");
    }
  }